

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

string_type * __thiscall
toml::basic_value<toml::type_config>::as_string_abi_cxx11_(basic_value<toml::type_config> *this)

{
  char *in_RDI;
  value_t in_stack_000000c7;
  string *in_stack_000000c8;
  basic_value<toml::type_config> *in_stack_000000d0;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  if (*in_RDI != '\x04') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    throw_bad_cast(in_stack_000000d0,in_stack_000000c8,in_stack_000000c7);
  }
  return (string_type *)(in_RDI + 8);
}

Assistant:

string_type& as_string()
    {
        if(this->type_ != value_t::string)
        {
            this->throw_bad_cast("toml::value::as_string()", value_t::string);
        }
        return this->string_.value;
    }